

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

size_t sentencepiece::string_util::EncodeUTF8(char32 c,char *output)

{
  char *output_local;
  char32 c_local;
  size_t local_8;
  
  if (c < 0x80) {
    *output = (byte)c;
    local_8 = 1;
  }
  else if (c < 0x800) {
    output[1] = (byte)c & 0x3f | 0x80;
    *output = (byte)(c >> 6) | 0xc0;
    local_8 = 2;
  }
  else {
    c_local = c;
    if (0x10ffff < c) {
      c_local = 0xfffd;
    }
    if (c_local < 0x10000) {
      output[2] = (byte)c_local & 0x3f | 0x80;
      output[1] = (byte)(c_local >> 6) & 0x3f | 0x80;
      *output = (byte)(c_local >> 0xc) | 0xe0;
      local_8 = 3;
    }
    else {
      output[3] = (byte)c_local & 0x3f | 0x80;
      output[2] = (byte)(c_local >> 6) & 0x3f | 0x80;
      output[1] = (byte)(c_local >> 0xc) & 0x3f | 0x80;
      *output = (byte)(c_local >> 0x12) | 0xf0;
      local_8 = 4;
    }
  }
  return local_8;
}

Assistant:

size_t EncodeUTF8(char32 c, char *output) {
  if (c <= 0x7F) {
    *output = static_cast<char>(c);
    return 1;
  }

  if (c <= 0x7FF) {
    output[1] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[0] = 0xC0 | c;
    return 2;
  }

  // if `c` is out-of-range, convert it to REPLACEMENT CHARACTER (U+FFFD).
  // This treatment is the same as the original runetochar.
  if (c > 0x10FFFF) c = kUnicodeError;

  if (c <= 0xFFFF) {
    output[2] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[1] = 0x80 | (c & 0x3F);
    c >>= 6;
    output[0] = 0xE0 | c;
    return 3;
  }

  output[3] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[2] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[1] = 0x80 | (c & 0x3F);
  c >>= 6;
  output[0] = 0xF0 | c;

  return 4;
}